

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.hpp
# Opt level: O3

int __thiscall diy::FileStorage::open_random(FileStorage *this,string *filename)

{
  char *pcVar1;
  size_t __n;
  int iVar2;
  char *pcVar3;
  pointer pbVar4;
  
  pbVar4 = (this->filename_templates_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((long)(this->filename_templates_).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar4 != 0x20) {
    iVar2 = rand();
    pbVar4 = (this->filename_templates_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar4 = pbVar4 + (ulong)(long)iVar2 %
                      (ulong)((long)(this->filename_templates_).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar4 >> 5);
  }
  pcVar3 = (pbVar4->_M_dataplus)._M_p;
  pcVar1 = (char *)filename->_M_string_length;
  strlen(pcVar3);
  std::__cxx11::string::_M_replace((ulong)filename,0,pcVar1,(ulong)pcVar3);
  __n = filename->_M_string_length;
  pcVar3 = (char *)operator_new__(__n + 1);
  if (__n != 0) {
    memmove(pcVar3,(filename->_M_dataplus)._M_p,__n);
  }
  pcVar3[__n] = '\0';
  iVar2 = mkostemp(pcVar3,0x101001);
  if (iVar2 != -1) {
    pcVar1 = (char *)filename->_M_string_length;
    strlen(pcVar3);
    std::__cxx11::string::_M_replace((ulong)filename,0,pcVar1,(ulong)pcVar3);
  }
  operator_delete__(pcVar3);
  return iVar2;
}

Assistant:

int           open_random(std::string& filename) const
      {
        if (filename_templates_.size() == 1)
            filename = filename_templates_[0].c_str();
        else
        {
            // pick a template at random (very basic load balancing mechanism)
            filename  = filename_templates_[static_cast<size_t>(std::rand()) % filename_templates_.size()].c_str();
        }
        int fh = diy::io::utils::mkstemp(filename);
        return fh;
      }